

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall ImFontGlyphRangesBuilder::SetBit(ImFontGlyphRangesBuilder *this,int n)

{
  uint *puVar1;
  
  if (n >> 5 < *(int *)this) {
    puVar1 = (uint *)(*(long *)(this + 8) + (long)(n >> 5) * 4);
    *puVar1 = *puVar1 | 1 << ((byte)n & 0x1f);
    return;
  }
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.h"
                ,0x4d7,"T &ImVector<int>::operator[](int) [T = int]");
}

Assistant:

bool            GetBit(int n) const { int off = (n >> 5); int mask = 1 << (n & 31); return (UsedChars[off] & mask) != 0; }